

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O0

errr finish_parse_ui_entry_renderer(parser *p)

{
  wchar_t wVar1;
  wchar_t local_14;
  wchar_t i;
  parser *p_local;
  
  local_14 = L'\0';
  do {
    if (renderer_count <= local_14) {
      parser_destroy(p);
      return 0;
    }
    if (renderers[local_14].comb_rend_nm != (char *)0x0) {
      wVar1 = ui_entry_renderer_lookup(renderers[local_14].comb_rend_nm);
      renderers[local_14].combined_renderer_index = wVar1;
      string_free(renderers[local_14].comb_rend_nm);
      renderers[local_14].comb_rend_nm = (char *)0x0;
    }
    if (renderers[local_14].backend != (backend_info *)0x0) {
      if (renderers[local_14].combiner_index == L'\0') {
        wVar1 = ui_entry_combiner_lookup((renderers[local_14].backend)->default_combiner_name);
        renderers[local_14].combiner_index = wVar1;
        if (renderers[local_14].combiner_index == L'\0') {
          __assert_fail("renderers[i].combiner_index != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-entry-renderers.c"
                        ,0x671,"errr finish_parse_ui_entry_renderer(struct parser *)");
        }
      }
      augment_colors((renderers[local_14].backend)->default_colors,&renderers[local_14].colors,
                     &renderers[local_14].ncolors);
      augment_colors((renderers[local_14].backend)->default_labelcolors,
                     &renderers[local_14].label_colors,&renderers[local_14].nlabcolors);
      augment_symbols((renderers[local_14].backend)->default_symbols,&renderers[local_14].symbols,
                      &renderers[local_14].nsym);
      if (renderers[local_14].ndigit == L'\x80000000') {
        renderers[local_14].ndigit = (renderers[local_14].backend)->default_ndigit;
      }
      if (renderers[local_14].sign == L'\x80000000') {
        renderers[local_14].sign = (renderers[local_14].backend)->default_sign;
      }
    }
    local_14 = local_14 + L'\x01';
  } while( true );
}

Assistant:

static errr finish_parse_ui_entry_renderer(struct parser *p)
{
	int i;

	for (i = 0; i < renderer_count; ++i) {
		/* Get the combined value renderer. */
		if (renderers[i].comb_rend_nm) {
			renderers[i].combined_renderer_index =
				ui_entry_renderer_lookup(renderers[i].comb_rend_nm);
			string_free(renderers[i].comb_rend_nm);
			renderers[i].comb_rend_nm = NULL;
		}

		if (!renderers[i].backend) {
			continue;
		}

		/* Use the default combiner if nothing was set. */
		if (!renderers[i].combiner_index) {
			renderers[i].combiner_index = ui_entry_combiner_lookup(
				renderers[i].backend->default_combiner_name);
			assert(renderers[i].combiner_index != 0);
		}

		/*
		 * If have fewer colors or symbols than the defaults for the
		 * backend, augment what was set with the default values.
		 */
		augment_colors(renderers[i].backend->default_colors,
			&renderers[i].colors, &renderers[i].ncolors);
		augment_colors(renderers[i].backend->default_labelcolors,
			&renderers[i].label_colors, &renderers[i].nlabcolors);
		augment_symbols(renderers[i].backend->default_symbols,
			&renderers[i].symbols, &renderers[i].nsym);

		if (renderers[i].ndigit == INT_MIN) {
			renderers[i].ndigit =
				renderers[i].backend->default_ndigit;
		}
		if (renderers[i].sign == UI_ENTRY_SIGN_DEFAULT) {
			renderers[i].sign =
				renderers[i].backend->default_sign;
		}
	}
	parser_destroy(p);
	return 0;
}